

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O1

void __thiscall
m2d::savanna::ssl_reuse::
https_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::error_callback(https_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
                 *this,error_code ec)

{
  delegate<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  *pdVar1;
  system_error local_158;
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  local_118;
  
  pdVar1 = this->delegate_;
  if (pdVar1 != (delegate<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
                 *)0x0) {
    std::runtime_error::runtime_error(&local_158.super_runtime_error,"");
    local_158._0_8_ = &PTR__system_error_0026dd98;
    local_158.m_what._M_dataplus._M_p = (pointer)((long)&local_158 + 0x30);
    local_158.m_what._M_string_length = 0;
    local_158.m_what.field_2._M_local_buf[0] = '\0';
    local_158.m_error_code._0_8_ = ec._0_8_;
    local_158.m_error_code.cat_ = ec.cat_;
    result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
    ::result(&local_118,&local_158);
    (**pdVar1->_vptr_delegate)(pdVar1,&local_118);
    if (local_118.error.super_type.m_initialized == true) {
      boost::system::system_error::~system_error
                ((system_error *)&local_118.error.super_type.m_storage);
      local_118.error.super_type.m_initialized = false;
    }
    boost::optional_detail::
    optional_base<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
    ::~optional_base((optional_base<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
                      *)&local_118);
    boost::system::system_error::~system_error(&local_158);
  }
  return;
}

Assistant:

void error_callback(beast::error_code ec) override {
			if(delegate_) delegate_->completion_callback(savanna::result<http::response<Body>>(beast::system_error { ec }));
		}